

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

bool clunk::VerifyMoveMap(int from,uint64_t map)

{
  uint uVar1;
  bool bVar2;
  int sqrs [128];
  int aiStack_218 [130];
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1c1,"bool clunk::VerifyMoveMap(const int, uint64_t)");
  }
  memset(aiStack_218,0,0x200);
  aiStack_218[(uint)from] = 1;
  bVar2 = map == 0;
  while ((((map & 0xff) != 0 && (uVar1 = (int)(map & 0xff) - 1, (uVar1 & 0xffffff88) == 0)) &&
         (aiStack_218[uVar1] == 0))) {
    aiStack_218[uVar1] = 1;
    bVar2 = map < 0x100;
    if (bVar2) {
      return bVar2;
    }
    map = map >> 8;
  }
  return bVar2;
}

Assistant:

bool VerifyMoveMap(const int from, uint64_t map) {
  assert(IS_SQUARE(from));
  int sqrs[128] = {0};
  int sqr;
  sqrs[from] = 1;
  while (map) {
    if (!(map & 0xFF)) {
      return false;
    }
    sqr = ((map & 0xFF) - 1);
    if (!IS_SQUARE(sqr)) {
      return false;
    }
    if (sqrs[sqr]) {
      return false;
    }
    sqrs[sqr] = 1;
    map >>= 8;
  }
  return true;
}